

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O0

void nn_aws_term(nn_aws *self)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_AWS_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
            ,0x46);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_item_term((nn_list_item *)0x1574cb);
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x1b48));
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x1b20));
  nn_sws_term((nn_sws *)0x1574fb);
  nn_usock_term((nn_usock *)0x157508);
  nn_fsm_term((nn_fsm *)0x157511);
  return;
}

Assistant:

void nn_aws_term (struct nn_aws *self)
{
    nn_assert_state (self, NN_AWS_STATE_IDLE);

    nn_list_item_term (&self->item);
    nn_fsm_event_term (&self->done);
    nn_fsm_event_term (&self->accepted);
    nn_sws_term (&self->sws);
    nn_usock_term (&self->usock);
    nn_fsm_term (&self->fsm);
}